

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System_test.cc
# Opt level: O2

void __thiscall EntitiesFixture::EntitiesFixture(EntitiesFixture *this)

{
  uint uVar1;
  int local_50;
  int local_4c;
  EntitiesFixture *local_48;
  Entity e;
  
  entityx::EntityX::EntityX(&this->super_EntityX);
  (this->created_entities).super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->created_entities).super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->created_entities).super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar1 = 0;
  local_48 = this;
  while( true ) {
    if (uVar1 == 0x96) break;
    e = entityx::EntityManager::create(&(this->super_EntityX).entities);
    Catch::clara::std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>::push_back
              (&this->created_entities,&e);
    if ((uVar1 & 1) == 0) {
      local_4c = 1;
      local_50 = 2;
      entityx::Entity::assign<Position,int,int>(&e,&local_4c,&local_50);
    }
    if ((char)((char)(((ushort)uVar1 & 0xff) / 3) * -3 + (char)uVar1) == '\0') {
      local_50 = 1;
      local_4c = local_50;
      entityx::Entity::assign<Direction,int,int>(&e,&local_4c,&local_50);
    }
    local_4c = 0;
    entityx::Entity::assign<Counter,int>(&e,&local_4c);
    uVar1 = uVar1 + 1;
  }
  return;
}

Assistant:

EntitiesFixture() {
    for (int i = 0; i < 150; ++i) {
      Entity e = entities.create();
      created_entities.push_back(e);
      if (i % 2 == 0) e.assign<Position>(1, 2);
      if (i % 3 == 0) e.assign<Direction>(1, 1);

      e.assign<Counter>(0);
    }
  }